

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeinfo.cpp
# Opt level: O3

void __thiscall hbm::streaming::timeInfo::set(timeInfo *this,Value *timeObject)

{
  bool bVar1;
  UInt UVar2;
  Value *pVVar3;
  Value *pVVar4;
  ulong uVar5;
  ulong uVar6;
  Value value;
  Value VStack_e8;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_48;
  
  pVVar3 = Json::Value::operator[](timeObject,"stamp");
  pVVar4 = Json::Value::operator[](pVVar3,"type");
  Json::Value::Value(&VStack_e8,"ntp");
  bVar1 = Json::Value::operator==(pVVar4,&VStack_e8);
  Json::Value::~Value(&VStack_e8);
  if (bVar1) {
    Json::Value::Value(&VStack_e8,nullValue);
    pVVar4 = Json::Value::operator[](pVVar3,"era");
    Json::Value::Value(&local_48,pVVar4);
    Json::Value::operator=(&VStack_e8,&local_48);
    Json::Value::~Value(&local_48);
    bVar1 = Json::Value::isNull(&VStack_e8);
    UVar2 = 0;
    if (!bVar1) {
      UVar2 = Json::Value::asUInt(&VStack_e8);
    }
    this->m_era = UVar2;
    pVVar4 = Json::Value::operator[](pVVar3,"seconds");
    Json::Value::Value(&local_70,pVVar4);
    Json::Value::operator=(&VStack_e8,&local_70);
    Json::Value::~Value(&local_70);
    bVar1 = Json::Value::isNull(&VStack_e8);
    if (bVar1) {
      uVar6 = 0;
    }
    else {
      UVar2 = Json::Value::asUInt(&VStack_e8);
      uVar6 = (ulong)UVar2 << 0x20;
    }
    pVVar4 = Json::Value::operator[](pVVar3,"fraction");
    Json::Value::Value(&local_98,pVVar4);
    Json::Value::operator=(&VStack_e8,&local_98);
    Json::Value::~Value(&local_98);
    bVar1 = Json::Value::isNull(&VStack_e8);
    if (bVar1) {
      uVar5 = 0;
    }
    else {
      UVar2 = Json::Value::asUInt(&VStack_e8);
      uVar5 = (ulong)UVar2;
    }
    this->m_ntpTimestamp = uVar5 | uVar6;
    pVVar3 = Json::Value::operator[](pVVar3,"subFraction");
    Json::Value::Value(&local_c0,pVVar3);
    Json::Value::operator=(&VStack_e8,&local_c0);
    Json::Value::~Value(&local_c0);
    bVar1 = Json::Value::isNull(&VStack_e8);
    UVar2 = 0;
    if (!bVar1) {
      UVar2 = Json::Value::asUInt(&VStack_e8);
    }
    this->m_subFraction = UVar2;
    Json::Value::~Value(&VStack_e8);
  }
  return;
}

Assistant:

void timeInfo::set(const Json::Value& timeObject)
		{
			try {
				const Json::Value& stmapNode = timeObject["stamp"];
				if(stmapNode["type"]=="ntp") {
					uint32_t seconds = 0;
					uint32_t fraction = 0;
					Json::Value value;
					value = stmapNode["era"];
					if(value.isNull()) {
						m_era = 0;
					} else {
						m_era = value.asUInt();
					}

					value = stmapNode["seconds"];
					if(value.isNull()==false) {
						seconds = value.asUInt();
					}

					value = stmapNode["fraction"];
					if(value.isNull()==false) {
						fraction = value.asUInt();
					}
					m_ntpTimestamp = seconds;
					m_ntpTimestamp <<= 32;
					m_ntpTimestamp |= fraction;

					value = stmapNode["subFraction"];
					if(value.isNull()) {
						m_subFraction = 0;
					} else {
						m_subFraction = value.asUInt();
					}
				}
			} catch(const std::runtime_error& e) {
				std::cerr << e.what();
			}
		}